

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 * cfd::core::HashUtil::Sha256D(ByteData256 *__return_storage_ptr__,Pubkey *pubkey)

{
  ByteData local_30;
  Pubkey *local_18;
  Pubkey *pubkey_local;
  
  local_18 = pubkey;
  pubkey_local = (Pubkey *)__return_storage_ptr__;
  Pubkey::GetData(&local_30,pubkey);
  Sha256D(__return_storage_ptr__,&local_30);
  ByteData::~ByteData(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256D(const Pubkey &pubkey) {
  return Sha256D(pubkey.GetData());
}